

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O1

void __thiscall kj::MainBuilder::Impl::~Impl(Impl *this)

{
  Iface *pIVar1;
  Disposer *pDVar2;
  Arg *pAVar3;
  RemoveConst<kj::MainBuilder::Impl::Arg> *pRVar4;
  Arg *pAVar5;
  ArrayDisposer *pAVar6;
  
  if (((this->finalCallback).ptr.isSet == true) &&
     (pIVar1 = (this->finalCallback).ptr.field_1.value.impl.ptr, pIVar1 != (Iface *)0x0)) {
    (this->finalCallback).ptr.field_1.value.impl.ptr = (Iface *)0x0;
    pDVar2 = (this->finalCallback).ptr.field_1.value.impl.disposer;
    (*(code *)**(undefined8 **)pDVar2)(pDVar2,pIVar1->_vptr_Iface[-2] + (long)&pIVar1->_vptr_Iface);
  }
  pAVar3 = (this->args).builder.ptr;
  if (pAVar3 != (Arg *)0x0) {
    pRVar4 = (this->args).builder.pos;
    pAVar5 = (this->args).builder.endPtr;
    (this->args).builder.ptr = (Arg *)0x0;
    (this->args).builder.pos = (RemoveConst<kj::MainBuilder::Impl::Arg> *)0x0;
    (this->args).builder.endPtr = (Arg *)0x0;
    pAVar6 = (this->args).builder.disposer;
    (*(code *)**(undefined8 **)pAVar6)
              (pAVar6,pAVar3,0x28,((long)pRVar4 - (long)pAVar3 >> 3) * -0x3333333333333333,
               ((long)pAVar5 - (long)pAVar3 >> 3) * -0x3333333333333333,
               ArrayDisposer::Dispose_<kj::MainBuilder::Impl::Arg,_false>::destruct);
  }
  std::
  _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>_>
  ::~_Rb_tree(&(this->subCommands)._M_t);
  std::
  _Rb_tree<kj::ArrayPtr<const_char>,_std::pair<const_kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*>,_std::_Select1st<std::pair<const_kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*>_>,_kj::MainBuilder::Impl::CharArrayCompare,_std::allocator<std::pair<const_kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*>_>_>
  ::~_Rb_tree(&(this->longOptions)._M_t);
  std::
  _Rb_tree<char,_std::pair<const_char,_kj::MainBuilder::Impl::Option_*>,_std::_Select1st<std::pair<const_char,_kj::MainBuilder::Impl::Option_*>_>,_std::less<char>,_std::allocator<std::pair<const_char,_kj::MainBuilder::Impl::Option_*>_>_>
  ::~_Rb_tree(&(this->shortOptions)._M_t);
  Arena::~Arena(&this->arena);
  return;
}

Assistant:

inline Impl(ProcessContext& context, StringPtr version,
              StringPtr briefDescription, StringPtr extendedDescription)
      : context(context), version(version),
        briefDescription(briefDescription), extendedDescription(extendedDescription) {}